

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clock.cpp
# Opt level: O0

void CheckBench(void)

{
  uint uVar1;
  uint32 uVar2;
  char *pcVar3;
  char *pcVar4;
  FILE *__stream;
  FILE *f;
  FString local_10;
  FString compose;
  
  if (((printstats != 0) && (ConsoleState == c_up)) &&
     ((waitstart == 0 || (uVar1 = I_MSTime(), waitstart + 5000 <= uVar1)))) {
    FString::FString(&local_10);
    pcVar3 = FString::GetChars(&level.MapName);
    pcVar4 = FString::GetChars(&level.LevelName);
    FString::Format(&local_10,
                    "Map %s: \"%s\",\nx = %1.4f, y = %1.4f, z = %1.4f, angle = %1.4f, pitch = %1.4f\n"
                    ,ViewPos.X,ViewPos.Y,ViewPos.Z,ViewAngle.Degrees,ViewPitch.Degrees,pcVar3,pcVar4
                   );
    AppendRenderStats(&local_10);
    AppendRenderTimes(&local_10);
    AppendLightStats(&local_10);
    AppendMissingTextureStats(&local_10);
    uVar2 = DFrameBuffer::GetLastFPS(screen);
    FString::AppendFormat(&local_10,"%d fps\n\n",(ulong)uVar2);
    __stream = fopen("benchmarks.txt","at");
    if (__stream != (FILE *)0x0) {
      pcVar3 = FString::GetChars(&local_10);
      fputs(pcVar3,__stream);
      fclose(__stream);
    }
    Printf("Benchmark info saved\n");
    if ((switchfps & 1U) != 0) {
      FBoolCVar::operator=(&vid_fps,false);
    }
    printstats = 0;
    FString::~FString(&local_10);
  }
  return;
}

Assistant:

void CheckBench()
{
	if (printstats && ConsoleState == c_up)
	{
		// if we started the FPS counter ourselves or ran from the console 
		// we need to wait for it to stabilize before using it.
		if (waitstart > 0 && I_MSTime() < waitstart + 5000) return;

		FString compose;

		compose.Format("Map %s: \"%s\",\nx = %1.4f, y = %1.4f, z = %1.4f, angle = %1.4f, pitch = %1.4f\n",
			level.MapName.GetChars(), level.LevelName.GetChars(), ViewPos.X, ViewPos.Y, ViewPos.Z, ViewAngle.Degrees, ViewPitch.Degrees);
		
		AppendRenderStats(compose);
		AppendRenderTimes(compose);
		AppendLightStats(compose);
		AppendMissingTextureStats(compose);
		compose.AppendFormat("%d fps\n\n", screen->GetLastFPS());

		FILE *f = fopen("benchmarks.txt", "at");
		if (f != NULL)
		{
			fputs(compose.GetChars(), f);
			fclose(f);
		}
		Printf("Benchmark info saved\n");
		if (switchfps) vid_fps = false;
		printstats = false;
	}
}